

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData160 * __thiscall
cfd::core::HashUtil::Output160(ByteData160 *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->hash_type_ == '\x02') {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                       &this->buffer_);
    Hash160(__return_storage_ptr__,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  }
  else {
    if (this->hash_type_ != '\x01') {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_38,"unknown hash type.",&local_39);
      CfdException::CfdException(this_00,kCfdInternalError,&local_38);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                       &this->buffer_);
    Ripemd160(__return_storage_ptr__,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Output160() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes());
    case kHash160:
      return Hash160(buffer_.GetBytes());
    case kSha256:
      // fall-through
    case kSha256D:
      // fall-through
    case kSha512:
      // fall-through
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}